

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zeCommandListUpdateMutableCommandKernelsExp
          (ze_command_list_handle_t hCommandList,uint32_t numKernels,uint64_t *pCommandId,
          ze_kernel_handle_t *phKernels)

{
  ze_pfnCommandListUpdateMutableCommandKernelsExp_t pfnUpdateMutableCommandKernelsExp;
  ze_result_t result;
  ze_kernel_handle_t *phKernels_local;
  uint64_t *pCommandId_local;
  uint32_t numKernels_local;
  ze_command_list_handle_t hCommandList_local;
  
  pfnUpdateMutableCommandKernelsExp._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c4a0 != (code *)0x0) {
    pfnUpdateMutableCommandKernelsExp._4_4_ =
         (*DAT_0011c4a0)(hCommandList,numKernels,pCommandId,phKernels);
  }
  return pfnUpdateMutableCommandKernelsExp._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeCommandListUpdateMutableCommandKernelsExp(
        ze_command_list_handle_t hCommandList,          ///< [in] handle of the command list
        uint32_t numKernels,                            ///< [in] the number of kernels to update
        uint64_t* pCommandId,                           ///< [in][range(0, numKernels)] command identifier
        ze_kernel_handle_t* phKernels                   ///< [in][range(0, numKernels)] handle of the kernel for a command
                                                        ///< identifier to switch to
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnUpdateMutableCommandKernelsExp = context.zeDdiTable.CommandListExp.pfnUpdateMutableCommandKernelsExp;
        if( nullptr != pfnUpdateMutableCommandKernelsExp )
        {
            result = pfnUpdateMutableCommandKernelsExp( hCommandList, numKernels, pCommandId, phKernels );
        }
        else
        {
            // generic implementation
        }

        return result;
    }